

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void gen_op_mov_reg_v(DisasContext *s,MemOp ot,int reg,TCGv_i64 t0)

{
  TCGContext *pTVar1;
  int iVar2;
  TCGv_i64 ret;
  TCGv_i64 ret_00;
  uint ofs;
  
  if (MO_64 < ot) {
    gen_op_mov_reg_v_cold_1();
    pTVar1 = s->uc->tcg_ctx;
    iVar2 = (int)t0;
    if ((0xfffffffb < iVar2 - 8U && ot == MO_8) && (s->x86_64_hregs == false)) {
      tcg_gen_extract_i64_x86_64(pTVar1,ret,pTVar1->cpu_regs[iVar2 - 4],8,8);
      return;
    }
    if (pTVar1->cpu_regs[iVar2] != ret) {
      tcg_gen_op2_x86_64(pTVar1,INDEX_op_mov_i64,(TCGArg)(ret + (long)pTVar1),
                         (TCGArg)(pTVar1->cpu_regs[iVar2] + (long)pTVar1));
      return;
    }
    return;
  }
  pTVar1 = s->uc->tcg_ctx;
  switch(ot) {
  case MO_8:
    if ((reg - 8U < 0xfffffffc) || (s->x86_64_hregs == true)) {
      ret_00 = pTVar1->cpu_regs[reg];
      ofs = 0;
    }
    else {
      ret_00 = pTVar1->cpu_regs[reg - 4];
      ofs = 8;
    }
    tcg_gen_deposit_i64_x86_64(pTVar1,ret_00,ret_00,t0,ofs,8);
    return;
  case MO_16:
    tcg_gen_deposit_i64_x86_64(pTVar1,pTVar1->cpu_regs[reg],pTVar1->cpu_regs[reg],t0,0,0x10);
    return;
  case MO_32:
    tcg_gen_ext32u_i64_x86_64(pTVar1,pTVar1->cpu_regs[reg],t0);
    return;
  }
  if (pTVar1->cpu_regs[reg] != t0) {
    tcg_gen_op2_x86_64(pTVar1,INDEX_op_mov_i64,(TCGArg)(pTVar1->cpu_regs[reg] + (long)pTVar1),
                       (TCGArg)(t0 + (long)pTVar1));
    return;
  }
  return;
}

Assistant:

static void gen_op_mov_reg_v(DisasContext *s, MemOp ot, int reg, TCGv t0)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;

    switch(ot) {
    case MO_8:
        if (!byte_reg_is_xH(s, reg)) {
            tcg_gen_deposit_tl(tcg_ctx, tcg_ctx->cpu_regs[reg], tcg_ctx->cpu_regs[reg], t0, 0, 8);
        } else {
            tcg_gen_deposit_tl(tcg_ctx, tcg_ctx->cpu_regs[reg - 4], tcg_ctx->cpu_regs[reg - 4], t0, 8, 8);
        }
        break;
    case MO_16:
        tcg_gen_deposit_tl(tcg_ctx, tcg_ctx->cpu_regs[reg], tcg_ctx->cpu_regs[reg], t0, 0, 16);
        break;
    case MO_32:
        /* For x86_64, this sets the higher half of register to zero.
           For i386, this is equivalent to a mov. */
        tcg_gen_ext32u_tl(tcg_ctx, tcg_ctx->cpu_regs[reg], t0);
        break;
#ifdef TARGET_X86_64
    case MO_64:
        tcg_gen_mov_tl(tcg_ctx, tcg_ctx->cpu_regs[reg], t0);
        break;
#endif
    default:
        tcg_abort();
    }
}